

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O2

void __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::LLVMDependenceGraphBuilder
          (LLVMDependenceGraphBuilder *this,Module *M,LLVMDependenceGraphOptions *opts)

{
  LLVMPointerAnalysis *pta;
  LLVMDataDependenceAnalysis *this_00;
  LLVMControlDependenceAnalysis *this_01;
  LLVMDependenceGraph *this_02;
  ControlFlowGraph *this_03;
  Function *pFVar1;
  StringRef SVar2;
  LLVMControlDependenceAnalysisOptions local_130;
  LLVMDataDependenceAnalysisOptions local_d0;
  
  this->_M = M;
  LLVMDependenceGraphOptions::LLVMDependenceGraphOptions(&this->_options,opts);
  pta = createPTA(this);
  (this->_PTA)._M_t.
  super___uniq_ptr_impl<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMPointerAnalysis_*,_std::default_delete<dg::LLVMPointerAnalysis>_>.
  super__Head_base<0UL,_dg::LLVMPointerAnalysis_*,_false>._M_head_impl = pta;
  this_00 = (LLVMDataDependenceAnalysis *)operator_new(0xc0);
  LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
            (&local_d0,&(this->_options).DDAOptions);
  dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis(this_00,M,pta,&local_d0);
  (this->_DDA)._M_t.
  super___uniq_ptr_impl<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::dda::LLVMDataDependenceAnalysis_*,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
  .super__Head_base<0UL,_dg::dda::LLVMDataDependenceAnalysis_*,_false>._M_head_impl = this_00;
  LLVMDataDependenceAnalysisOptions::~LLVMDataDependenceAnalysisOptions(&local_d0);
  this_01 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            (&local_130,&(this->_options).CDAOptions);
  this_03 = (ControlFlowGraph *)0x0;
  LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
            (this_01,M,&local_130,(LLVMPointerAnalysis *)0x0);
  (this->_CDA)._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl = this_01;
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions(&local_130);
  this_02 = (LLVMDependenceGraph *)operator_new(0x158);
  LLVMDependenceGraph::LLVMDependenceGraph(this_02,opts->threads);
  (this->_dg)._M_t.
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = this_02;
  if (((this->_options).threads == true) && ((this->_options).PTAOptions.analysisType != svf)) {
    this_03 = (ControlFlowGraph *)operator_new(0x18);
    ControlFlowGraph::ControlFlowGraph
              (this_03,(DGLLVMPointerAnalysis *)
                       (this->_PTA)._M_t.
                       super___uniq_ptr_impl<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::LLVMPointerAnalysis_*,_std::default_delete<dg::LLVMPointerAnalysis>_>
                       .super__Head_base<0UL,_dg::LLVMPointerAnalysis_*,_false>._M_head_impl);
  }
  (this->_controlFlowGraph)._M_t.
  super___uniq_ptr_impl<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_>._M_t.
  super__Tuple_impl<0UL,_ControlFlowGraph_*,_std::default_delete<ControlFlowGraph>_>.
  super__Head_base<0UL,_ControlFlowGraph_*,_false>._M_head_impl = this_03;
  SVar2.Length = (size_t)(this->_options).entryFunction._M_dataplus._M_p;
  SVar2.Data = (char *)M;
  pFVar1 = (Function *)llvm::Module::getFunction(SVar2);
  this->_entryFunction = pFVar1;
  (this->_statistics).cdaTime = 0;
  (this->_statistics).ptaTime = 0;
  (this->_statistics).rdaTime = 0;
  (this->_statistics).inferaTime = 0;
  (this->_statistics).joinsTime = 0;
  (this->_statistics).critsecTime = 0;
  return;
}

Assistant:

LLVMDependenceGraphBuilder(llvm::Module *M,
                               const LLVMDependenceGraphOptions &opts)
            : _M(M), _options(opts), _PTA(createPTA()),
              _DDA(new LLVMDataDependenceAnalysis(M, _PTA.get(),
                                                  _options.DDAOptions)),
              _CDA(new LLVMControlDependenceAnalysis(M, _options.CDAOptions)),
              _dg(new LLVMDependenceGraph(opts.threads)),
              _controlFlowGraph(
                      _options.threads && !_options.PTAOptions.isSVF()
                              ? // check SVF due to the static cast...
                              new ControlFlowGraph(
                                      static_cast<DGLLVMPointerAnalysis *>(
                                              _PTA.get()))
                              : nullptr),
              _entryFunction(M->getFunction(_options.entryFunction)) {
        assert(_entryFunction && "The entry function not found");
    }